

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::processAuthority(XMLCh *authSpec,XMLSize_t authLen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  XMLSize_t XVar4;
  ulong uVar5;
  int port;
  XMLCh *host;
  XMLSize_t hostLen;
  ulong uVar6;
  XMLCh *local_40;
  
  iVar2 = XMLString::indexOf(authSpec,L'@');
  if ((ulong)(long)iVar2 < authLen) {
    uVar6 = (ulong)(iVar2 + 1);
    local_40 = authSpec;
  }
  else {
    uVar6 = 0;
    local_40 = L"";
    iVar2 = 0;
  }
  hostLen = authLen - uVar6;
  if ((authLen < uVar6 || hostLen == 0) || (authSpec[uVar6] != L'[')) {
    iVar3 = XMLString::indexOf(authSpec + uVar6,L':');
    if ((ulong)(long)iVar3 < authLen) goto LAB_0026b385;
  }
  else {
    iVar3 = XMLString::indexOf(authSpec + uVar6,L']');
    if ((iVar3 != -1) &&
       ((authLen <= (ulong)(long)iVar3 ||
        (((uVar5 = (long)iVar3 + uVar6 + 1, uVar5 < authLen && (authSpec[uVar5] == L':')) &&
         (iVar3 = iVar3 + 1, iVar3 != -1)))))) {
LAB_0026b385:
      hostLen = (XMLSize_t)iVar3;
      XVar4 = hostLen + uVar6 + 1;
      bVar1 = true;
      goto LAB_0026b3a4;
    }
  }
  bVar1 = false;
  XVar4 = authLen;
LAB_0026b3a4:
  host = authSpec + uVar6;
  iVar3 = -1;
  port = iVar3;
  if (((bVar1) && (hostLen != 0)) && ((XVar4 < authLen && (authSpec[XVar4] != L'\0')))) {
    port = 0;
    for (; authLen != XVar4; XVar4 = XVar4 + 1) {
      if ((ushort)(authSpec[XVar4] + L'ￆ') < 0xfff6) {
        iVar2 = 0;
        hostLen = 0;
        local_40 = L"";
        host = L"";
        port = iVar3;
        break;
      }
      port = port * 10 + (uint)(ushort)authSpec[XVar4] + -0x30;
    }
  }
  bVar1 = isValidServerBasedAuthority(host,hostLen,port,local_40,(long)iVar2);
  if (bVar1) {
    return true;
  }
  bVar1 = isValidRegistryBasedAuthority(authSpec,authLen);
  return bVar1;
}

Assistant:

bool XMLUri::processAuthority( const XMLCh* const authSpec
                             , const XMLSize_t authLen)
{
    int index = XMLString::indexOf(authSpec, chAt);
    XMLSize_t start = 0;

    // server = [ [ userinfo "@" ] hostport ]
    // userinfo is everything up @,
    const XMLCh* userinfo;
    int userInfoLen = 0;
    if ((index != -1) && (XMLSize_t(index) < authLen))
    {
        userinfo = authSpec;
        userInfoLen = index;
        start = index + 1;
    }
    else
    {
        userinfo = XMLUni::fgZeroLenString;
    }

    // hostport = host [ ":" port ]
    // host is everything up to ':', or up to
    // and including ']' if followed by ':'.
    //
    // Search for port boundary.
    const XMLCh* host;
    XMLSize_t hostLen = 0;
    if ((start < authLen) && (authSpec[start] == chOpenSquare))
    {
    	index = XMLString::indexOf(&(authSpec[start]), chCloseSquare);
    	if ((index != -1) && (XMLSize_t(index) < authLen))
    	{
            // skip the ']'
            index = ((start + index + 1) < authLen
              && authSpec[start + index + 1] == chColon) ? index+1 : -1;
    	}
    }
    else
    {
        index = XMLString::indexOf(&(authSpec[start]), chColon);
        if (index!=-1 && XMLSize_t(index) >= authLen)
            index = -1;
    }

    host = &(authSpec[start]);
    if (index != -1)
    {
        hostLen = index;
        start += index + 1;  // skip the :
    }
    else
    {
        hostLen = authLen - start;
        start = authLen;
    }

    // port is everything after ":"
    int port = -1;
    if ((hostLen) &&   // non empty host
        (index != -1)                    &&   // ":" found
        (start < authLen)                     )   // ":" is not the last
    {
        const XMLCh* portStr = &(authSpec[start]);
        if (*portStr)
        {
            port = 0;
            for (XMLSize_t i=0; i<(authLen - start); i++)
            {
                if (portStr[i] < chDigit_0 || portStr[i] > chDigit_9)
                {
                  // Assume this is a registry-based authority.
                  //
                  port = -1;
                  hostLen = 0;
                  host = XMLUni::fgZeroLenString;
                  userInfoLen = 0;
                  userinfo = XMLUni::fgZeroLenString;
                  break;
                }

                port = (port * 10) + (int) (portStr[i] - chDigit_0);
            }
        }
    }

    return isValidServerBasedAuthority(host, hostLen, port, userinfo, userInfoLen)
      || isValidRegistryBasedAuthority(authSpec, authLen);
}